

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

int compar_string(void *pa,void *pb)

{
  int iVar1;
  char *sb;
  char *sa;
  
  if (pa == (void *)0x0) {
    return -(uint)(pb != (void *)0x0);
  }
  if (pb == (void *)0x0) {
    return 1;
  }
  iVar1 = strcmp((char *)pa,(char *)pb);
  return iVar1;
}

Assistant:

static int compar_string(const void* pa, const void* pb)
{
  const char* sa = (const char*)pa;
  const char* sb = (const char*)pb;
  if ( !sa ) {
    return (sb) ? -1 : 0;
  }
  else if ( !sb ) {
    return 1;
  }
  return strcmp(sa,sb);
}